

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9MemObjToInteger(jx9_value *pObj)

{
  sxi64 sVar1;
  jx9_value *pObj_local;
  
  if ((pObj->iFlags & 2U) == 0) {
    sVar1 = MemObjIntValue(pObj);
    (pObj->x).iVal = sVar1;
    SyBlobRelease(&pObj->sBlob);
    pObj->iFlags = pObj->iFlags & 0xfffffe90U | 2;
  }
  return 0;
}

Assistant:

JX9_PRIVATE sxi32 jx9MemObjToInteger(jx9_value *pObj)
{
	if( (pObj->iFlags & MEMOBJ_INT) == 0 ){
		/* Preform the conversion */
		pObj->x.iVal = MemObjIntValue(&(*pObj));
		/* Invalidate any prior representations */
		SyBlobRelease(&pObj->sBlob);
		MemObjSetType(pObj, MEMOBJ_INT);
	}
	return SXRET_OK;
}